

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

void icu_63::CalendarCache::createCache(CalendarCache **cache,UErrorCode *status)

{
  UBool UVar1;
  CalendarCache *this;
  code *size;
  CalendarCache *local_40;
  UErrorCode *status_local;
  CalendarCache **cache_local;
  
  size = calendar_astro_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_ASTRO_CALENDAR,calendar_astro_cleanup);
  if (cache == (CalendarCache **)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    this = (CalendarCache *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
    local_40 = (CalendarCache *)0x0;
    if (this != (CalendarCache *)0x0) {
      CalendarCache(this,0x20,status);
      local_40 = this;
    }
    *cache = local_40;
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') {
      if (*cache != (CalendarCache *)0x0) {
        (*(*cache)->_vptr_CalendarCache[1])();
      }
      *cache = (CalendarCache *)0x0;
    }
  }
  return;
}

Assistant:

void CalendarCache::createCache(CalendarCache** cache, UErrorCode& status) {
    ucln_i18n_registerCleanup(UCLN_I18N_ASTRO_CALENDAR, calendar_astro_cleanup);
    if(cache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        *cache = new CalendarCache(32, status);
        if(U_FAILURE(status)) {
            delete *cache;
            *cache = NULL;
        }
    }
}